

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjpeg.c
# Opt level: O1

int main(int argc,char **argv)

{
  int *piVar1;
  int iVar2;
  JDIMENSION num_lines;
  boolean bVar3;
  int iVar4;
  FILE *__stream;
  j_compress_ptr __stream_00;
  size_t __size;
  j_compress_ptr pjVar5;
  size_t sVar6;
  cjpeg_source_ptr pcVar7;
  int iVar8;
  j_compress_ptr pjVar9;
  long extraout_RDX;
  char *filename;
  size_t unaff_RBP;
  J_COLOR_SPACE colorspace;
  boolean in_R8D;
  FILE *__stream_01;
  char *arg;
  long unaff_R14;
  char *pcVar10;
  long lVar11;
  char *filename_00;
  bool bVar12;
  unsigned_long outsize;
  uchar *outbuffer;
  jpeg_compress_struct cinfo;
  cdjpeg_progress_mgr progress;
  jpeg_error_mgr jerr;
  byte bStack_3a9;
  j_compress_ptr pjStack_3a8;
  ulong uStack_3a0;
  int iStack_394;
  undefined8 uStack_390;
  char *pcStack_388;
  int iStack_37c;
  char *pcStack_378;
  char *pcStack_370;
  FILE *pFStack_368;
  ulong uStack_360;
  j_compress_ptr pjStack_358;
  long lStack_350;
  j_compress_ptr pjStack_348;
  code *pcStack_340;
  FILE *local_338;
  unsigned_long local_330;
  uchar *local_328;
  char **local_320;
  jpeg_compress_struct local_318;
  cdjpeg_progress_mgr local_110 [3];
  long local_58;
  char **local_40;
  undefined8 local_38;
  
  local_328 = (uchar *)0x0;
  local_330 = 0;
  progname = *argv;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "cjpeg";
  }
  __stream = (FILE *)(local_110 + 1);
  pcStack_340 = (code *)0x1055f1;
  local_318.err = jpeg_std_error((jpeg_error_mgr *)__stream);
  pcStack_340 = (code *)0x10560b;
  jpeg_CreateCompress(&local_318,0x3e,0x208);
  local_40 = cdjpeg_message_table;
  local_38 = 0x417000003e8;
  local_318.in_color_space = JCS_RGB;
  pcStack_340 = (code *)0x10563a;
  jpeg_set_defaults(&local_318);
  pcStack_340 = (code *)0x10564a;
  iVar2 = parse_switches(&local_318,argc,argv,0,in_R8D);
  iVar8 = argc + -1;
  __stream_00 = &local_318;
  if (iVar2 < iVar8) {
LAB_001059dd:
    pcStack_340 = (code *)0x1059e2;
    main_cold_8();
    __size = unaff_RBP;
    pjVar5 = __stream_00;
LAB_001059e2:
    __stream_00 = pjVar5;
    pcStack_340 = (code *)0x1059e7;
    main_cold_5();
LAB_001059e7:
    pcStack_340 = (code *)0x1059ef;
    main_cold_3();
  }
  else {
    if (iVar2 < argc) {
      unaff_R14 = (long)iVar2;
      pcStack_340 = (code *)0x105670;
      __stream = fopen(argv[unaff_R14],"rb");
      if (__stream == (FILE *)0x0) {
        pcStack_340 = (code *)0x105688;
        main_cold_7();
        goto LAB_00105688;
      }
    }
    else {
LAB_00105688:
      pcStack_340 = (code *)0x10568d;
      __stream = (FILE *)read_stdin();
    }
    if (outfilename == (char *)0x0) {
LAB_001056b6:
      if (memdst == 0) {
        pcStack_340 = (code *)0x1056ce;
        local_338 = (FILE *)write_stdout();
      }
      else {
        local_338 = (FILE *)0x0;
      }
    }
    else {
      pcStack_340 = (code *)0x1056a8;
      local_338 = fopen(outfilename,"wb");
      if (local_338 == (FILE *)0x0) {
        pcStack_340 = (code *)0x1056b6;
        main_cold_1();
        goto LAB_001056b6;
      }
    }
    local_320 = argv;
    if (icc_filename == (char *)0x0) {
      pjVar5 = (j_compress_ptr)0x0;
      __size = 0;
LAB_0010577d:
      if (report != 0) {
        pcStack_340 = (code *)0x10579b;
        start_progress_monitor((j_common_ptr)&local_318,local_110);
        local_110[0].report = report;
      }
      if (is_targa == '\x01') {
LAB_001057ae:
        pcStack_340 = (code *)0x1057b8;
        pcVar7 = jinit_read_targa(&local_318);
      }
      else {
        pcStack_340 = (code *)0x10581c;
        iVar2 = getc(__stream);
        if (iVar2 == -1) {
          (local_318.err)->msg_code = 0x2a;
          pcStack_340 = (code *)0x105835;
          (*(local_318.err)->error_exit)((j_common_ptr)&local_318);
        }
        pcStack_340 = (code *)0x105840;
        iVar8 = ungetc(iVar2,__stream);
        if (iVar8 == -1) {
          (local_318.err)->msg_code = 0x414;
          pcStack_340 = (code *)0x105856;
          (*(local_318.err)->error_exit)((j_common_ptr)&local_318);
        }
        if (iVar2 < 0x47) {
          if (iVar2 == 0) goto LAB_001057ae;
          if (iVar2 == 0x42) {
            pcStack_340 = (code *)0x105882;
            pcVar7 = jinit_read_bmp(&local_318,1);
            goto LAB_001057bb;
          }
        }
        else {
          if (iVar2 == 0x47) {
            pcStack_340 = (code *)0x1059c2;
            pcVar7 = jinit_read_gif(&local_318);
            goto LAB_001057bb;
          }
          if (iVar2 == 0x50) {
            pcStack_340 = (code *)0x10599a;
            pcVar7 = jinit_read_ppm(&local_318);
            goto LAB_001057bb;
          }
        }
        (local_318.err)->msg_code = 0x415;
        pcStack_340 = (code *)0x1059b0;
        (*(local_318.err)->error_exit)((j_common_ptr)&local_318);
        pcVar7 = (cjpeg_source_ptr)0x0;
      }
LAB_001057bb:
      pcVar7->input_file = (FILE *)__stream;
      pcStack_340 = (code *)0x1057cd;
      (*pcVar7->start_input)(&local_318,pcVar7);
      pcStack_340 = (code *)0x1057d5;
      jpeg_default_colorspace(&local_318);
      pcStack_340 = (code *)0x1057ea;
      parse_switches(&local_318,argc,local_320,1,in_R8D);
      __stream_01 = local_338;
      if (memdst == 0) {
        pcStack_340 = (code *)0x105898;
        jpeg_stdio_dest(&local_318,(FILE *)local_338);
      }
      else {
        pcStack_340 = (code *)0x10580b;
        jpeg_mem_dest(&local_318,&local_328,&local_330);
        __stream_01 = local_338;
      }
      pcStack_340 = (code *)0x1058a7;
      jpeg_start_compress(&local_318,1);
      if (pjVar5 != (j_compress_ptr)0x0) {
        pcStack_340 = (code *)0x1058bb;
        jpeg_write_icc_profile(&local_318,(JOCTET *)pjVar5,(uint)__size);
      }
      if (local_318.next_scanline < local_318.image_height) {
        do {
          pcStack_340 = (code *)0x1058d7;
          num_lines = (*pcVar7->get_pixel_rows)(&local_318,pcVar7);
          pcStack_340 = (code *)0x1058e5;
          jpeg_write_scanlines(&local_318,pcVar7->buffer,num_lines);
        } while (local_318.next_scanline < local_318.image_height);
      }
      pcStack_340 = (code *)0x105901;
      (*pcVar7->finish_input)(&local_318,pcVar7);
      pcStack_340 = (code *)0x105909;
      jpeg_finish_compress(&local_318);
      pcStack_340 = (code *)0x105911;
      jpeg_destroy_compress(&local_318);
      if (__stream != _stdin) {
        pcStack_340 = (code *)0x105925;
        fclose(__stream);
      }
      if ((__stream_01 != (FILE *)0x0) && (__stream_01 != _stdout)) {
        pcStack_340 = (code *)0x10593e;
        fclose(__stream_01);
      }
      if (report != 0) {
        pcStack_340 = (code *)0x105951;
        end_progress_monitor((j_common_ptr)&local_318);
      }
      if (memdst != 0) {
        pcStack_340 = (code *)0x1059d6;
        main_cold_6();
      }
      pcStack_340 = (code *)0x105962;
      free(pjVar5);
      return (uint)(local_58 != 0) * 2;
    }
    pcStack_340 = (code *)0x1056f3;
    __stream_00 = (j_compress_ptr)fopen(icc_filename,"rb");
    __size = unaff_RBP;
    pjVar5 = &local_318;
    if (__stream_00 == (j_compress_ptr)0x0) goto LAB_001059e2;
    pcStack_340 = (code *)0x10570e;
    iVar2 = fseek((FILE *)__stream_00,0,2);
    if (iVar2 < 0) {
LAB_001059d8:
      pcStack_340 = (code *)0x1059dd;
      main_cold_4();
      goto LAB_001059dd;
    }
    pcStack_340 = (code *)0x10571e;
    __size = ftell((FILE *)__stream_00);
    if ((long)__size < 1) goto LAB_001059d8;
    pcStack_340 = (code *)0x105736;
    iVar2 = fseek((FILE *)__stream_00,0,0);
    unaff_RBP = __size;
    if (iVar2 < 0) goto LAB_001059d8;
    pcStack_340 = (code *)0x105746;
    pjVar5 = (j_compress_ptr)malloc(__size);
    if (pjVar5 == (j_compress_ptr)0x0) goto LAB_001059e7;
    pcStack_340 = (code *)0x105765;
    pjVar9 = __stream_00;
    sVar6 = fread(pjVar5,__size,1,(FILE *)__stream_00);
    iVar8 = (int)pjVar9;
    argv = (char **)pjVar5;
    if (sVar6 != 0) {
      pcStack_340 = (code *)0x105776;
      fclose((FILE *)__stream_00);
      goto LAB_0010577d;
    }
  }
  pcStack_340 = parse_switches;
  pjVar5 = __stream_00;
  pjVar9 = (j_compress_ptr)argv;
  main_cold_2();
  is_targa = '\0';
  icc_filename = (char *)0x0;
  outfilename = (char *)0x0;
  memdst = 0;
  report = 0;
  pjVar9->err->trace_level = 0;
  iVar2 = (int)pjVar5;
  pjStack_3a8 = pjVar9;
  iStack_37c = iVar8;
  pFStack_368 = __stream;
  uStack_360 = (ulong)(uint)argc;
  pjStack_358 = (j_compress_ptr)argv;
  lStack_350 = unaff_R14;
  pjStack_348 = __stream_00;
  pcStack_340 = (code *)__size;
  if (iVar2 < 2) {
    uStack_390 = 0;
    bVar12 = true;
    iVar8 = 1;
    arg = (char *)0x0;
    filename = (char *)0x0;
    pcStack_388 = (char *)0x0;
    pcVar10 = (char *)0x0;
    filename_00 = (char *)0x0;
LAB_00106082:
    if (iStack_37c == 0) {
      return iVar8;
    }
    if ((((arg == (char *)0x0) ||
         (bVar3 = set_quality_ratings(pjStack_3a8,arg,(boolean)uStack_390), bVar3 != 0)) &&
        (((filename == (char *)0x0 ||
          (bVar3 = read_quant_tables(pjStack_3a8,filename,(boolean)uStack_390), bVar3 != 0)) &&
         ((pcStack_388 == (char *)0x0 ||
          (bVar3 = set_quant_slots(pjStack_3a8,pcStack_388), bVar3 != 0)))))) &&
       ((pcVar10 == (char *)0x0 || (bVar3 = set_sample_factors(pjStack_3a8,pcVar10), bVar3 != 0))))
    {
      if (!bVar12) {
        jpeg_simple_progression(pjStack_3a8);
      }
      if (filename_00 == (char *)0x0) {
        return iVar8;
      }
      bVar3 = read_scan_script(pjStack_3a8,filename_00);
      if (bVar3 != 0) {
        return iVar8;
      }
    }
LAB_00106127:
    usage();
LAB_0010612c:
    parse_switches_cold_2();
    fprintf(_stderr,"usage: %s [switches] ",progname);
    fwrite("[inputfile]\n",0xc,1,_stderr);
    fwrite("Switches (names may be abbreviated):\n",0x25,1,_stderr);
    fwrite("  -quality N[,...]   Compression quality (0..100; 5-95 is most useful range,\n",0x4d,1,
           _stderr);
    fwrite("                     default is 75)\n",0x24,1,_stderr);
    fwrite("  -grayscale     Create monochrome JPEG file\n",0x2d,1,_stderr);
    fwrite("  -rgb           Create RGB JPEG file\n",0x26,1,_stderr);
    fwrite("  -optimize      Optimize Huffman table (smaller file, but slow compression)\n",0x4d,1,
           _stderr);
    fwrite("  -progressive   Create progressive JPEG file\n",0x2e,1,_stderr);
    fwrite("  -targa         Input file is Targa format (usually not needed)\n",0x41,1,_stderr);
    fwrite("Switches for advanced users:\n",0x1d,1,_stderr);
    fwrite("  -arithmetic    Use arithmetic coding\n",0x27,1,_stderr);
    fprintf(_stderr,"  -dct int       Use accurate integer DCT method%s\n"," (default)");
    fprintf(_stderr,"  -dct fast      Use less accurate integer DCT method [legacy feature]%s\n","")
    ;
    fprintf(_stderr,"  -dct float     Use floating-point DCT method [legacy feature]%s\n","");
    fwrite("  -icc FILE      Embed ICC profile contained in FILE\n",0x35,1,_stderr);
    fwrite("  -restart N     Set restart interval in rows, or in blocks with B\n",0x43,1,_stderr);
    fwrite("  -smooth N      Smooth dithered input (N=1..100 is strength)\n",0x3e,1,_stderr);
    fwrite("  -maxmemory N   Maximum memory to use (in kbytes)\n",0x33,1,_stderr);
    fwrite("  -outfile name  Specify name for output file\n",0x2e,1,_stderr);
    fwrite("  -memdst        Compress to memory instead of file (useful for benchmarking)\n",0x4e,1,
           _stderr);
    fwrite("  -report        Report compression progress\n",0x2d,1,_stderr);
    fwrite("  -verbose  or  -debug   Emit debug output\n",0x2b,1,_stderr);
    fwrite("  -version       Print version information and exit\n",0x34,1,_stderr);
    fwrite("Switches for wizards:\n",0x16,1,_stderr);
    fwrite("  -baseline      Force baseline quantization tables\n",0x34,1,_stderr);
    fwrite("  -qtables FILE  Use quantization tables given in FILE\n",0x37,1,_stderr);
    fwrite("  -qslots N[,...]    Set component quantization tables\n",0x37,1,_stderr);
    fwrite("  -sample HxV[,...]  Set component sampling factors\n",0x34,1,_stderr);
    fwrite("  -scans FILE    Create multi-scan JPEG per script FILE\n",0x38,1,_stderr);
    exit(1);
  }
  iVar8 = 1;
  pcStack_370 = (char *)0x0;
  pcStack_378 = (char *)0x0;
  pcStack_388 = (char *)0x0;
  filename = (char *)0x0;
  arg = (char *)0x0;
  iStack_394 = 0;
  uStack_390 = 0;
LAB_00105a7f:
  pcVar10 = *(char **)(extraout_RDX + (long)iVar8 * 8);
  if (*pcVar10 == '-') {
    pcVar10 = pcVar10 + 1;
    bVar3 = keymatch(pcVar10,"arithmetic",1);
    if (bVar3 == 0) {
      bVar3 = keymatch(pcVar10,"baseline",1);
      if (bVar3 == 0) {
        bVar3 = keymatch(pcVar10,"dct",2);
        if (bVar3 == 0) {
          bVar3 = keymatch(pcVar10,"debug",1);
          if ((bVar3 == 0) && (bVar3 = keymatch(pcVar10,"verbose",1), bVar3 == 0)) {
            bVar3 = keymatch(pcVar10,"version",4);
            if (bVar3 != 0) goto LAB_0010612c;
            bVar3 = keymatch(pcVar10,"grayscale",2);
            if ((bVar3 == 0) && (bVar3 = keymatch(pcVar10,"greyscale",2), bVar3 == 0)) {
              bVar3 = keymatch(pcVar10,"rgb",3);
              if (bVar3 == 0) {
                bVar3 = keymatch(pcVar10,"icc",1);
                if (bVar3 == 0) {
                  bVar3 = keymatch(pcVar10,"maxmemory",3);
                  if (bVar3 == 0) {
                    bVar3 = keymatch(pcVar10,"optimize",1);
                    if ((bVar3 == 0) && (bVar3 = keymatch(pcVar10,"optimise",1), bVar3 == 0)) {
                      bVar3 = keymatch(pcVar10,"outfile",4);
                      if (bVar3 == 0) {
                        bVar3 = keymatch(pcVar10,"progressive",1);
                        if (bVar3 != 0) {
                          iStack_394 = 1;
                          goto LAB_00105acb;
                        }
                        bVar3 = keymatch(pcVar10,"memdst",2);
                        if (bVar3 == 0) {
                          bVar3 = keymatch(pcVar10,"quality",1);
                          if (bVar3 == 0) {
                            bVar3 = keymatch(pcVar10,"qslots",2);
                            if (bVar3 == 0) {
                              bVar3 = keymatch(pcVar10,"qtables",2);
                              if (bVar3 == 0) {
                                bVar3 = keymatch(pcVar10,"report",3);
                                if (bVar3 == 0) {
                                  bVar3 = keymatch(pcVar10,"restart",1);
                                  if (bVar3 == 0) {
                                    bVar3 = keymatch(pcVar10,"sample",2);
                                    if (bVar3 == 0) {
                                      bVar3 = keymatch(pcVar10,"scans",4);
                                      if (bVar3 == 0) {
                                        bVar3 = keymatch(pcVar10,"smooth",2);
                                        if (bVar3 == 0) {
                                          bVar3 = keymatch(pcVar10,"targa",1);
                                          if (bVar3 == 0) goto LAB_00106127;
                                          is_targa = '\x01';
                                        }
                                        else {
                                          iVar8 = iVar8 + 1;
                                          if (((iVar2 <= iVar8) ||
                                              (iVar4 = __isoc99_sscanf(*(undefined8 *)
                                                                        (extraout_RDX +
                                                                        (long)iVar8 * 8),"%d",
                                                                       &uStack_3a0), iVar4 != 1)) ||
                                             (100 < (uint)uStack_3a0)) goto LAB_00106127;
                                          pjStack_3a8->smoothing_factor = (uint)uStack_3a0;
                                        }
                                      }
                                      else {
                                        iVar8 = iVar8 + 1;
                                        if (iVar2 <= iVar8) goto LAB_00106127;
                                        pcStack_370 = *(char **)(extraout_RDX + (long)iVar8 * 8);
                                      }
                                    }
                                    else {
                                      iVar8 = iVar8 + 1;
                                      if (iVar2 <= iVar8) goto LAB_00106127;
                                      pcStack_378 = *(char **)(extraout_RDX + (long)iVar8 * 8);
                                    }
                                  }
                                  else {
                                    bStack_3a9 = 0x78;
                                    iVar8 = iVar8 + 1;
                                    if (((iVar2 <= iVar8) ||
                                        (iVar4 = __isoc99_sscanf(*(undefined8 *)
                                                                  (extraout_RDX + (long)iVar8 * 8),
                                                                 "%ld%c",&uStack_3a0,&bStack_3a9),
                                        iVar4 < 1)) || (0xffff < uStack_3a0)) goto LAB_00106127;
                                    if ((bStack_3a9 & 0xdf) == 0x42) {
                                      pjStack_3a8->restart_interval = (uint)uStack_3a0;
                                      pjStack_3a8->restart_in_rows = 0;
                                    }
                                    else {
                                      pjStack_3a8->restart_in_rows = (uint)uStack_3a0;
                                    }
                                  }
                                }
                                else {
                                  report = 1;
                                }
                              }
                              else {
                                iVar8 = iVar8 + 1;
                                if (iVar2 <= iVar8) goto LAB_00106127;
                                filename = *(char **)(extraout_RDX + (long)iVar8 * 8);
                              }
                            }
                            else {
                              iVar8 = iVar8 + 1;
                              if (iVar2 <= iVar8) goto LAB_00106127;
                              pcStack_388 = *(char **)(extraout_RDX + (long)iVar8 * 8);
                            }
                          }
                          else {
                            iVar8 = iVar8 + 1;
                            if (iVar2 <= iVar8) goto LAB_00106127;
                            arg = *(char **)(extraout_RDX + (long)iVar8 * 8);
                          }
                        }
                        else {
                          memdst = 1;
                        }
                      }
                      else {
                        iVar8 = iVar8 + 1;
                        if (iVar2 <= iVar8) goto LAB_00106127;
                        outfilename = *(char **)(extraout_RDX + (long)iVar8 * 8);
                      }
                    }
                    else {
                      pjStack_3a8->optimize_coding = 1;
                    }
                  }
                  else {
                    bStack_3a9 = 0x78;
                    iVar8 = iVar8 + 1;
                    if ((iVar2 <= iVar8) ||
                       (iVar4 = __isoc99_sscanf(*(undefined8 *)(extraout_RDX + (long)iVar8 * 8),
                                                "%ld%c",&uStack_3a0,&bStack_3a9), iVar4 < 1))
                    goto LAB_00106127;
                    if ((bStack_3a9 & 0xdf) == 0x4d) {
                      uStack_3a0 = uStack_3a0 * 1000;
                    }
                    pjStack_3a8->mem->max_memory_to_use = uStack_3a0 * 1000;
                  }
                }
                else {
                  iVar8 = iVar8 + 1;
                  if (iVar2 <= iVar8) goto LAB_00106127;
                  icc_filename = *(char **)(extraout_RDX + (long)iVar8 * 8);
                }
                goto LAB_00105acb;
              }
              colorspace = JCS_RGB;
            }
            else {
              colorspace = JCS_GRAYSCALE;
            }
            jpeg_set_colorspace(pjStack_3a8,colorspace);
          }
          else {
            if (parse_switches_printed_version == '\0') {
              parse_switches_cold_1();
            }
            piVar1 = &pjStack_3a8->err->trace_level;
            *piVar1 = *piVar1 + 1;
          }
        }
        else {
          iVar8 = iVar8 + 1;
          if (iVar2 <= iVar8) goto LAB_00106127;
          lVar11 = (long)iVar8;
          bVar3 = keymatch(*(char **)(extraout_RDX + lVar11 * 8),"int",1);
          if (bVar3 == 0) {
            bVar3 = keymatch(*(char **)(extraout_RDX + lVar11 * 8),"fast",2);
            if (bVar3 == 0) {
              bVar3 = keymatch(*(char **)(extraout_RDX + lVar11 * 8),"float",2);
              if (bVar3 == 0) goto LAB_00106127;
              pjStack_3a8->dct_method = JDCT_FLOAT;
            }
            else {
              pjStack_3a8->dct_method = JDCT_IFAST;
            }
          }
          else {
            pjStack_3a8->dct_method = JDCT_ISLOW;
          }
        }
      }
      else {
        uStack_390 = 1;
      }
    }
    else {
      pjStack_3a8->arith_code = 1;
    }
  }
  else {
    if (0 < iVar8) goto LAB_0010606f;
    outfilename = (char *)0x0;
  }
LAB_00105acb:
  iVar8 = iVar8 + 1;
  if (iVar2 <= iVar8) goto LAB_0010606f;
  goto LAB_00105a7f;
LAB_0010606f:
  bVar12 = iStack_394 == 0;
  pcVar10 = pcStack_378;
  filename_00 = pcStack_370;
  goto LAB_00106082;
}

Assistant:

int
main(int argc, char **argv)
{
  struct jpeg_compress_struct cinfo;
#ifdef CJPEG_FUZZER
  struct my_error_mgr myerr;
  struct jpeg_error_mgr &jerr = myerr.pub;
#else
  struct jpeg_error_mgr jerr;
#endif
  struct cdjpeg_progress_mgr progress;
  int file_index;
  cjpeg_source_ptr src_mgr;
  FILE *input_file = NULL;
  FILE *icc_file;
  JOCTET *icc_profile = NULL;
  long icc_len = 0;
  FILE *output_file = NULL;
  unsigned char *outbuffer = NULL;
  unsigned long outsize = 0;
  JDIMENSION num_scanlines;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "cjpeg";         /* in case C library doesn't provide it */

  /* Initialize the JPEG compression object with default error handling. */
  cinfo.err = jpeg_std_error(&jerr);
  jpeg_create_compress(&cinfo);
  /* Add some application-specific error messages (from cderror.h) */
  jerr.addon_message_table = cdjpeg_message_table;
  jerr.first_addon_message = JMSG_FIRSTADDONCODE;
  jerr.last_addon_message = JMSG_LASTADDONCODE;

  /* Initialize JPEG parameters.
   * Much of this may be overridden later.
   * In particular, we don't yet know the input file's color space,
   * but we need to provide some value for jpeg_set_defaults() to work.
   */

  cinfo.in_color_space = JCS_RGB; /* arbitrary guess */
  jpeg_set_defaults(&cinfo);

  /* Scan command line to find file names.
   * It is convenient to use just one switch-parsing routine, but the switch
   * values read here are ignored; we will rescan the switches after opening
   * the input file.
   */

  file_index = parse_switches(&cinfo, argc, argv, 0, FALSE);

#ifdef TWO_FILE_COMMANDLINE
  if (!memdst) {
    /* Must have either -outfile switch or explicit output file name */
    if (outfilename == NULL) {
      if (file_index != argc - 2) {
        fprintf(stderr, "%s: must name one input and one output file\n",
                progname);
        usage();
      }
      outfilename = argv[file_index + 1];
    } else {
      if (file_index != argc - 1) {
        fprintf(stderr, "%s: must name one input and one output file\n",
                progname);
        usage();
      }
    }
  }
#else
  /* Unix style: expect zero or one file name */
  if (file_index < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
#endif /* TWO_FILE_COMMANDLINE */

  /* Open the input file. */
  if (file_index < argc) {
    if ((input_file = fopen(argv[file_index], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, argv[file_index]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
    input_file = read_stdin();
  }

  /* Open the output file. */
  if (outfilename != NULL) {
    if ((output_file = fopen(outfilename, WRITE_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, outfilename);
      exit(EXIT_FAILURE);
    }
  } else if (!memdst) {
    /* default output file is stdout */
    output_file = write_stdout();
  }

  if (icc_filename != NULL) {
    if ((icc_file = fopen(icc_filename, READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, icc_filename);
      exit(EXIT_FAILURE);
    }
    if (fseek(icc_file, 0, SEEK_END) < 0 ||
        (icc_len = ftell(icc_file)) < 1 ||
        fseek(icc_file, 0, SEEK_SET) < 0) {
      fprintf(stderr, "%s: can't determine size of %s\n", progname,
              icc_filename);
      exit(EXIT_FAILURE);
    }
    if ((icc_profile = (JOCTET *)malloc(icc_len)) == NULL) {
      fprintf(stderr, "%s: can't allocate memory for ICC profile\n", progname);
      fclose(icc_file);
      exit(EXIT_FAILURE);
    }
    if (fread(icc_profile, icc_len, 1, icc_file) < 1) {
      fprintf(stderr, "%s: can't read ICC profile from %s\n", progname,
              icc_filename);
      free(icc_profile);
      fclose(icc_file);
      exit(EXIT_FAILURE);
    }
    fclose(icc_file);
  }

#ifdef CJPEG_FUZZER
  jerr.error_exit = my_error_exit;
  jerr.emit_message = my_emit_message;
  if (setjmp(myerr.setjmp_buffer))
    HANDLE_ERROR()
#endif

  if (report) {
    start_progress_monitor((j_common_ptr)&cinfo, &progress);
    progress.report = report;
  }

  /* Figure out the input file format, and set up to read it. */
  src_mgr = select_file_type(&cinfo, input_file);
  src_mgr->input_file = input_file;
#ifdef CJPEG_FUZZER
  src_mgr->max_pixels = 1048576;
#endif

  /* Read the input file header to obtain file size & colorspace. */
  (*src_mgr->start_input) (&cinfo, src_mgr);

  /* Now that we know input colorspace, fix colorspace-dependent defaults */
  jpeg_default_colorspace(&cinfo);

  /* Adjust default compression parameters by re-parsing the options */
  file_index = parse_switches(&cinfo, argc, argv, 0, TRUE);

  /* Specify data destination for compression */
#if JPEG_LIB_VERSION >= 80 || defined(MEM_SRCDST_SUPPORTED)
  if (memdst)
    jpeg_mem_dest(&cinfo, &outbuffer, &outsize);
  else
#endif
    jpeg_stdio_dest(&cinfo, output_file);

#ifdef CJPEG_FUZZER
  if (setjmp(myerr.setjmp_buffer))
    HANDLE_ERROR()
#endif

  /* Start compressor */
  jpeg_start_compress(&cinfo, TRUE);

  if (icc_profile != NULL)
    jpeg_write_icc_profile(&cinfo, icc_profile, (unsigned int)icc_len);

  /* Process data */
  while (cinfo.next_scanline < cinfo.image_height) {
    num_scanlines = (*src_mgr->get_pixel_rows) (&cinfo, src_mgr);
    (void)jpeg_write_scanlines(&cinfo, src_mgr->buffer, num_scanlines);
  }

  /* Finish compression and release memory */
  (*src_mgr->finish_input) (&cinfo, src_mgr);
  jpeg_finish_compress(&cinfo);
  jpeg_destroy_compress(&cinfo);

  /* Close files, if we opened them */
  if (input_file != stdin)
    fclose(input_file);
  if (output_file != stdout && output_file != NULL)
    fclose(output_file);

  if (report)
    end_progress_monitor((j_common_ptr)&cinfo);

  if (memdst) {
#ifndef CJPEG_FUZZER
    fprintf(stderr, "Compressed size:  %lu bytes\n", outsize);
#endif
    free(outbuffer);
  }

  free(icc_profile);

  /* All done. */
  return (jerr.num_warnings ? EXIT_WARNING : EXIT_SUCCESS);
}